

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueLittleInt16::read
          (PLYValueLittleInt16 *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = std::streambuf::sbumpc();
  this->value = (ushort)bVar1;
  iVar2 = std::streambuf::sbumpc();
  this->value = this->value | (ushort)(iVar2 << 8);
  return (ulong)(uint)(iVar2 << 8);
}

Assistant:

void read(std::streambuf *in)
    {
      value=static_cast<short>(in->sbumpc()&0xff);
      value|=static_cast<short>(in->sbumpc()<<8);
    }